

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_run_container_ixor(bitset_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  _Bool _Var1;
  
  _Var1 = run_bitset_container_xor(src_2,src_1,dst);
  bitset_container_free(src_1);
  return _Var1;
}

Assistant:

bool bitset_run_container_ixor(bitset_container_t *src_1,
                               const run_container_t *src_2,
                               container_t **dst) {
    bool ans = run_bitset_container_xor(src_2, src_1, dst);
    bitset_container_free(src_1);
    return ans;
}